

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultVAOCase::iterate(DefaultVAOCase *this)

{
  ostringstream *this_00;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  char *description;
  CallLogWrapper gl;
  Buffer buffer;
  CallLogWrapper local_1c0;
  Enum<int,_2UL> local_1a8;
  undefined1 local_198 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_1c0,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).m_context)->m_testCtx->m_log);
  local_1c0.m_enableLog = true;
  switch(this->m_caseType) {
  case CASE_BIND_VERTEX_BUFFER:
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    traits = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper
              ((ObjectWrapper *)local_198,(Functions *)CONCAT44(extraout_var_00,iVar1),traits);
    glu::CallLogWrapper::glBindVertexBuffer(&local_1c0,0,local_198._16_4_,0,0);
    glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_198);
    break;
  case CASE_VERTEX_ATTRIB_FORMAT:
    glu::CallLogWrapper::glVertexAttribFormat(&local_1c0,0,4,0x1406,'\0',0);
    break;
  case CASE_VERTEX_ATTRIB_I_FORMAT:
    glu::CallLogWrapper::glVertexAttribIFormat(&local_1c0,0,4,0x1404,0);
    break;
  case CASE_VERTEX_ATTRIB_BINDING:
    glu::CallLogWrapper::glVertexAttribBinding(&local_1c0,0,0);
    break;
  case CASE_VERTEX_BINDING_DIVISOR:
    glu::CallLogWrapper::glVertexBindingDivisor(&local_1c0,0,1);
  }
  GVar2 = glu::CallLogWrapper::glGetError(&local_1c0);
  if (GVar2 != 0x502) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"ERROR! Expected GL_INVALID_OPERATION, got ",0x2a);
    local_1a8.m_getName = glu::getErrorName;
    local_1a8.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1a8,(ostream *)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
    description = "Invalid error";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(GVar2 != 0x502),
             description);
  glu::CallLogWrapper::~CallLogWrapper(&local_1c0);
  return STOP;
}

Assistant:

DefaultVAOCase::IterateResult DefaultVAOCase::iterate (void)
{
	glw::GLenum			error	= 0;
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	gl.enableLogging(true);

	switch (m_caseType)
	{
		case CASE_BIND_VERTEX_BUFFER:
		{
			glu::Buffer buffer(m_context.getRenderContext());
			gl.glBindVertexBuffer(0, *buffer, 0, 0);
			break;
		}

		case CASE_VERTEX_ATTRIB_FORMAT:
			gl.glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, 0);
			break;

		case CASE_VERTEX_ATTRIB_I_FORMAT:
			gl.glVertexAttribIFormat(0, 4, GL_INT, 0);
			break;

		case CASE_VERTEX_ATTRIB_BINDING:
			gl.glVertexAttribBinding(0, 0);
			break;

		case CASE_VERTEX_BINDING_DIVISOR:
			gl.glVertexBindingDivisor(0, 1);
			break;

		default:
			DE_ASSERT(false);
	}

	error = gl.glGetError();

	if (error != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR! Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}